

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O2

void __thiscall icu_63::UnifiedCache::UnifiedCache(UnifiedCache *this,UErrorCode *status)

{
  SharedObject *pSVar1;
  UHashtable *hash;
  
  (this->super_UnifiedCacheBase).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnifiedCache_003e4988;
  this->fHashtable = (UHashtable *)0x0;
  this->fEvictPos = -1;
  this->fNumValuesTotal = 0;
  this->fNumValuesInUse = 0;
  this->fMaxUnused = 1000;
  this->fMaxPercentageOfInUse = 100;
  this->fAutoEvictedCount = 0;
  this->fNoValue = (SharedObject *)0x0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    pSVar1 = (SharedObject *)UMemory::operator_new((UMemory *)0x18,(size_t)status);
    if (pSVar1 == (SharedObject *)0x0) {
      this->fNoValue = (SharedObject *)0x0;
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      (pSVar1->super_UObject)._vptr_UObject = (_func_int **)&PTR__SharedObject_003db170;
      pSVar1->softRefCount = 0;
      pSVar1->hardRefCount = (__atomic_base<int>)0x0;
      pSVar1->cachePtr = (UnifiedCacheBase *)0x0;
      this->fNoValue = pSVar1;
      pSVar1->softRefCount = 1;
      LOCK();
      (pSVar1->hardRefCount).super___atomic_base<int>._M_i = 1;
      UNLOCK();
      this->fNoValue->cachePtr = &this->super_UnifiedCacheBase;
      hash = uhash_open_63(ucache_hashKeys_63,ucache_compareKeys_63,(undefined1 *)0x0,status);
      this->fHashtable = hash;
      if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
        uhash_setKeyDeleter_63(hash,ucache_deleteKey_63);
      }
    }
  }
  return;
}

Assistant:

UnifiedCache::UnifiedCache(UErrorCode &status) :
        fHashtable(NULL),
        fEvictPos(UHASH_FIRST),
        fNumValuesTotal(0),
        fNumValuesInUse(0),
        fMaxUnused(DEFAULT_MAX_UNUSED),
        fMaxPercentageOfInUse(DEFAULT_PERCENTAGE_OF_IN_USE),
        fAutoEvictedCount(0),
        fNoValue(nullptr) {
    if (U_FAILURE(status)) {
        return;
    }
    fNoValue = new SharedObject();
    if (fNoValue == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    fNoValue->softRefCount = 1;  // Add fake references to prevent fNoValue from being deleted
    fNoValue->hardRefCount = 1;  // when other references to it are removed.
    fNoValue->cachePtr = this;

    fHashtable = uhash_open(
            &ucache_hashKeys,
            &ucache_compareKeys,
            NULL,
            &status);
    if (U_FAILURE(status)) {
        return;
    }
    uhash_setKeyDeleter(fHashtable, &ucache_deleteKey);
}